

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O3

vector<PointData,_std::allocator<PointData>_> * __thiscall
Harris::GetMaximaPoints
          (vector<PointData,_std::allocator<PointData>_> *__return_storage_ptr__,Harris *this,
          float percentage,int filterRange,int suppressionRadius)

{
  value_type *__x;
  int iVar1;
  int iVar2;
  pointer pPVar3;
  ulong uVar4;
  pointer pPVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int c;
  int iVar9;
  bool bVar10;
  vector<PointData,_std::allocator<PointData>_> points;
  Mat maximaSuppressionMat;
  value_type local_c4;
  vector<PointData,_std::allocator<PointData>_> local_b8;
  undefined8 uStack_a0;
  Mat local_90 [16];
  long local_80;
  long *local_48;
  
  local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  uStack_a0 = 0;
  local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cv::Mat::Mat(local_90,*(int *)&this->field_0x8,*(int *)&this->field_0xc,5,(Scalar_ *)&local_b8);
  local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  iVar1 = *(int *)&this->field_0x8;
  if (0 < iVar1) {
    uVar4 = (ulong)*(uint *)&this->field_0xc;
    lVar7 = 0;
    do {
      if (0 < (int)uVar4) {
        lVar6 = 0;
        do {
          local_c4.cornerResponse =
               *(float *)(**(long **)&this->field_0x48 * lVar7 + *(long *)&this->field_0x10 +
                         lVar6 * 4);
          local_c4.point.x = (int)lVar7;
          local_c4.point.y = (int)lVar6;
          std::vector<PointData,_std::allocator<PointData>_>::push_back(&local_b8,&local_c4);
          lVar6 = lVar6 + 1;
          uVar4 = (ulong)*(int *)&this->field_0xc;
        } while (lVar6 < (long)uVar4);
        iVar1 = *(int *)&this->field_0x8;
      }
      pPVar5 = local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pPVar3 = local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar1);
    if (local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar4 = ((long)local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      lVar7 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<PointData*,std::vector<PointData,std::allocator<PointData>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<CornerResponse>>
                (local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<PointData*,std::vector<PointData,std::allocator<PointData>>>,__gnu_cxx::__ops::_Iter_comp_iter<CornerResponse>>
                (pPVar3,pPVar5);
      iVar1 = *(int *)&this->field_0x8;
    }
  }
  iVar1 = (int)((float)(iVar1 * *(int *)&this->field_0xc) * percentage);
  (__return_storage_ptr__->super__Vector_base<PointData,_std::allocator<PointData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PointData,_std::allocator<PointData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PointData,_std::allocator<PointData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar1 != 0) {
    pPVar3 = (pointer)0x0;
    pPVar5 = (pointer)0x0;
    lVar7 = 0;
    do {
      if (((long)local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - lVar7 == 0) break;
      iVar8 = local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7].point.x;
      iVar9 = local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7].point.y;
      lVar6 = *local_48;
      if (*(int *)(lVar6 * iVar8 + local_80 + (long)iVar9 * 4) == 0) {
        __x = local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7;
        iVar2 = -suppressionRadius;
        if (-1 < suppressionRadius) {
          do {
            iVar9 = -suppressionRadius;
            iVar8 = suppressionRadius * 2 + 1;
            do {
              *(undefined4 *)
               (((__x->point).x + iVar9) * lVar6 + local_80 +
               ((long)(__x->point).y + (long)iVar2) * 4) = 1;
              iVar9 = iVar9 + 1;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
            bVar10 = iVar2 != suppressionRadius;
            iVar2 = iVar2 + 1;
          } while (bVar10);
          iVar8 = (__x->point).x;
          iVar9 = (__x->point).y;
        }
        (__x->point).x = iVar8 + filterRange + 1;
        (__x->point).y = iVar9 + filterRange + 1;
        std::vector<PointData,_std::allocator<PointData>_>::push_back(__return_storage_ptr__,__x);
        pPVar3 = (__return_storage_ptr__->super__Vector_base<PointData,_std::allocator<PointData>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar5 = (__return_storage_ptr__->super__Vector_base<PointData,_std::allocator<PointData>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar7 = lVar7 + 1;
    } while ((ulong)(((long)pPVar5 - (long)pPVar3 >> 2) * -0x5555555555555555) < (ulong)(long)iVar1)
    ;
  }
  if (local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(local_90);
  return __return_storage_ptr__;
}

Assistant:

vector<PointData> Harris::GetMaximaPoints(float percentage, int filterRange, int suppressionRadius) {
    // Declare a max suppression matrix
    Mat maximaSuppressionMat(harrisResponses.rows, harrisResponses.cols, CV_32F, Scalar::all(0));

    // Create a vector of all Points
    std::vector<PointData> points;
    for (int r = 0; r < harrisResponses.rows; r++) {
        for (int c = 0; c < harrisResponses.cols; c++) {
            Point p(r,c); 

            PointData d;
            d.cornerResponse = harrisResponses.at<float>(r,c);
            d.point = p;

            points.push_back(d);
        }
    }

    // Sort points by corner Response
    sort(points.begin(), points.end(), CornerResponse());

    // Get top points, given by the percentage
    int numberTopPoints = harrisResponses.cols * harrisResponses.rows * percentage;
    std::vector<PointData> topPoints;

    int i=0;
    while(topPoints.size() < numberTopPoints) {
        if(i == points.size())
            break;

        int supRows = maximaSuppressionMat.rows;
        int supCols = maximaSuppressionMat.cols;

        // Check if point marked in maximaSuppression matrix
        if(maximaSuppressionMat.at<int>(points[i].point.x,points[i].point.y) == 0) {
            for (int r = -suppressionRadius; r <= suppressionRadius; r++) {
                for (int c = -suppressionRadius; c <= suppressionRadius; c++) {
                    int sx = points[i].point.x+c;
                    int sy = points[i].point.y+r;

                    // bound checking
                    if(sx > supRows)
                        sx = supRows;
                    if(sx < 0)
                        sx = 0;
                    if(sy > supCols)
                        sy = supCols;
                    if(sy < 0)
                        sy = 0;

                    maximaSuppressionMat.at<int>(points[i].point.x+c, points[i].point.y+r) = 1;
                }
            }

            // Convert back to original image coordinate system 
            points[i].point.x += 1 + filterRange;
            points[i].point.y += 1 + filterRange;
            topPoints.push_back(points[i]);
        }

        i++;
    }

    return topPoints;
}